

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

int Nwk_ManLevelMax(Nwk_Man_t *pNtk)

{
  long *plVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  pVVar3 = pNtk->vCos;
  if (pVVar3->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar5];
      if (((*(uint *)(plVar1 + 4) & 7) == 2) &&
         (((*(Tim_Man_t **)(*plVar1 + 0x48) == (Tim_Man_t *)0x0 ||
           (iVar2 = Tim_ManBoxForCo(*(Tim_Man_t **)(*plVar1 + 0x48),*(uint *)(plVar1 + 4) >> 7),
           iVar2 == -1)) && (iVar4 <= *(int *)((long)plVar1 + 0x2c))))) {
        iVar4 = *(int *)((long)plVar1 + 0x2c);
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar5 < pVVar3->nSize);
  }
  return iVar4;
}

Assistant:

int Nwk_ManLevelMax( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int i, LevelMax = 0;
    Nwk_ManForEachPo( pNtk, pObj, i )
        if ( LevelMax < Nwk_ObjLevel(pObj) )
            LevelMax = Nwk_ObjLevel(pObj);
    return LevelMax;
}